

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::OnetimeMarshalAttribute
          (BP5Serializer *this,char *Name,DataType Type,size_t ElemCount,void *Data)

{
  void *pvVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 *__s;
  ulong in_RCX;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  void *in_R8;
  PrimitiveTypeAttr *ThisAttr_1;
  char *Array;
  size_t i;
  string *StrArray;
  string *Str;
  StringArrayAttr *ThisAttr;
  char *TmpName;
  BP5AttrStruct *in_stack_fffffffffffffed0;
  allocator *paVar4;
  string local_f8 [12];
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  allocator local_a9;
  string local_a8 [36];
  DataType in_stack_ffffffffffffff7c;
  allocator local_71;
  string local_70 [32];
  ulong local_50;
  void *local_48;
  void *local_40;
  undefined8 *local_38;
  char *local_30;
  void *local_28;
  ulong local_20;
  int local_14;
  char *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_RDI[0x10] == 0) {
    pvVar1 = operator_new(0x20);
    BP5Base::BP5AttrStruct::BP5AttrStruct(in_stack_fffffffffffffed0);
    in_RDI[0x10] = (long)pvVar1;
  }
  sVar2 = strlen(local_10);
  local_30 = (char *)malloc(sVar2 + 2);
  *local_30 = (char)local_14 + '0';
  if (local_20 != 0xffffffffffffffff) {
    *local_30 = *local_30 + '\x12';
  }
  strcpy(local_30 + 1,local_10);
  if (local_14 == 0xe) {
    *(long *)(in_RDI[0x10] + 0x10) = *(long *)(in_RDI[0x10] + 0x10) + 1;
    pvVar1 = realloc(*(void **)(in_RDI[0x10] + 0x18),*(long *)(in_RDI[0x10] + 0x10) * 0x18);
    *(void **)(in_RDI[0x10] + 0x18) = pvVar1;
    local_38 = (undefined8 *)
               (*(long *)(in_RDI[0x10] + 0x18) + (*(long *)(in_RDI[0x10] + 0x10) + -1) * 0x18);
    memset(local_38,0,0x18);
    *local_38 = local_30;
    if (local_20 == 0xffffffffffffffff) {
      local_40 = local_28;
      local_38[1] = 1;
      pvVar1 = malloc(8);
      local_38[2] = pvVar1;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = strdup(pcVar3);
      *(char **)local_38[2] = pcVar3;
    }
    else {
      local_48 = local_28;
      local_38[1] = local_20;
      pvVar1 = malloc(local_20 << 3);
      local_38[2] = pvVar1;
      for (local_50 = 0; local_50 < local_20; local_50 = local_50 + 1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar3 = strdup(pcVar3);
        *(char **)(local_38[2] + local_50 * 8) = pcVar3;
      }
    }
  }
  else {
    if ((local_14 == 0) || (local_14 == 0x10)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Toolkit",&local_71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"format::BP5Serializer",&local_a9);
      paVar4 = (allocator *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"doesn\'t support this type of Attribute",paVar4
                );
      ToString_abi_cxx11_(in_stack_ffffffffffffff7c);
      helper::Throw<std::logic_error>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    *(long *)in_RDI[0x10] = *(long *)in_RDI[0x10] + 1;
    pvVar1 = realloc(*(void **)(in_RDI[0x10] + 8),*(long *)in_RDI[0x10] * 0x18);
    *(void **)(in_RDI[0x10] + 8) = pvVar1;
    __s = (undefined8 *)(*(long *)(in_RDI[0x10] + 8) + (*(long *)in_RDI[0x10] + -1) * 0x18);
    if (local_20 == 0xffffffffffffffff) {
      local_20 = 1;
    }
    memset(__s,0,0x18);
    *__s = local_30;
    __s[1] = local_20 * *(long *)((long)in_RDI + (long)local_14 * 8 + *(long *)(*in_RDI + -0x18));
    pvVar1 = malloc(__s[1]);
    __s[2] = pvVar1;
    memcpy((void *)__s[2],local_28,__s[1]);
  }
  return;
}

Assistant:

void BP5Serializer::OnetimeMarshalAttribute(const char *Name, const DataType Type, size_t ElemCount,
                                            const void *Data)
{
    if (!PendingAttrs)
        PendingAttrs = new (BP5AttrStruct);
    char *TmpName = (char *)malloc(strlen(Name) + 2);
    TmpName[0] = '0' + (int)Type;
    if (ElemCount != (size_t)-1)
        TmpName[0] += 18; // indicates an array
    strcpy(&TmpName[1], Name);
    if (Type == DataType::String)
    {
        PendingAttrs->StrAttrCount++;
        PendingAttrs->StrAttrs = (struct StringArrayAttr *)realloc(
            PendingAttrs->StrAttrs, sizeof(StringArrayAttr) * PendingAttrs->StrAttrCount);
        StringArrayAttr *ThisAttr = &PendingAttrs->StrAttrs[PendingAttrs->StrAttrCount - 1];
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        if (ElemCount == (size_t)-1)
        {
            std::string *Str = (std::string *)Data;
            ThisAttr->ElementCount = 1;
            ThisAttr->Values = (const char **)malloc(sizeof(char *));
            ThisAttr->Values[0] = strdup(Str->c_str());
        }
        else
        {
            std::string *StrArray = (std::string *)Data;
            ThisAttr->ElementCount = ElemCount;
            ThisAttr->Values = (const char **)malloc(sizeof(char *) * ElemCount);
            for (size_t i = 0; i < ElemCount; i++)
            {
                ThisAttr->Values[i] = strdup(StrArray[i].c_str());
            }
        }
    }
    else
    {
        if ((Type == DataType::None) || (Type == DataType::Struct))
        {
            helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer",
                                            "doesn't support this type of Attribute",
                                            ToString(Type));
        }
        char *Array = (char *)Data;
        PendingAttrs->PrimAttrCount++;
        PendingAttrs->PrimAttrs = (struct PrimitiveTypeAttr *)realloc(
            PendingAttrs->PrimAttrs, sizeof(PrimitiveTypeAttr) * PendingAttrs->PrimAttrCount);
        PrimitiveTypeAttr *ThisAttr = &PendingAttrs->PrimAttrs[PendingAttrs->PrimAttrCount - 1];
        if (ElemCount == (size_t)-1)
        {
            ElemCount = 1;
        }
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        ThisAttr->TotalElementSize = ElemCount * DataTypeSize[(int)Type];
        ThisAttr->Values = (char *)malloc(ThisAttr->TotalElementSize);
        std::memcpy((void *)ThisAttr->Values, (void *)Array, ThisAttr->TotalElementSize);
    }
}